

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O1

bool __thiscall
tetgenmesh::formcavity
          (tetgenmesh *this,triface *searchtet,arraypool *missingshs,arraypool *crosstets,
          arraypool *topfaces,arraypool *botfaces,arraypool *toppoints,arraypool *botpoints)

{
  uint *puVar1;
  ulong *puVar2;
  tetrahedron *pppdVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  tetrahedron Q;
  tetrahedron Q_00;
  tetrahedron P;
  shellface *pppdVar7;
  char **ppcVar8;
  point pdVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  uint uVar13;
  char *pcVar14;
  int *piVar15;
  char *pcVar16;
  unsigned_long uVar17;
  int *piVar18;
  tetrahedron *pppdVar19;
  shellface p3;
  long lVar20;
  shellface p2;
  uint uVar21;
  tetrahedron *pppdVar22;
  long lVar23;
  long lVar24;
  shellface p1;
  triface *iedge;
  tetrahedron *pppdVar25;
  ulong uVar26;
  face *local_d0;
  char *local_c8;
  triface local_b0;
  int types [2];
  long local_78;
  triface local_68;
  int poss [4];
  
  local_b0.tet = (tetrahedron *)0x0;
  local_b0.ver = 0;
  local_68.tet = (tetrahedron *)0x0;
  local_68.ver = 0;
  if (2 < this->b->verbose) {
    puts("      Form the cavity of a missing region.");
  }
  puVar1 = (uint *)((long)searchtet->tet + (long)this->elemmarkerindex * 4);
  *puVar1 = *puVar1 | 0x40 << (*(byte *)(ver2edge + searchtet->ver) & 0x1f);
  local_c8 = arraypool::getblock(topfaces,(int)topfaces->objects);
  uVar6 = topfaces->objects;
  lVar23 = (long)topfaces->objectbytes * ((long)topfaces->objectsperblock - 1U & uVar6);
  lVar24 = uVar6 + 1;
  topfaces->objects = lVar24;
  *(tetrahedron **)(local_c8 + lVar23) = searchtet->tet;
  *(int *)(local_c8 + lVar23 + 8) = searchtet->ver;
  if ((long)uVar6 < 0) {
    bVar11 = false;
  }
  else {
    local_78 = 0;
    bVar11 = false;
    local_d0 = (face *)0x0;
    do {
      pcVar16 = topfaces->toparray[(uint)local_78 >> ((byte)topfaces->log2objectsperblock & 0x1f)];
      lVar23 = (long)topfaces->objectbytes *
               (long)(int)(topfaces->objectsperblockmark & (uint)local_78);
      lVar24 = *(long *)(*(long *)(pcVar16 + lVar23) +
                        (long)orgpivot[*(int *)(pcVar16 + lVar23 + 8)] * 8);
      uVar21 = *(uint *)(lVar24 + 4 + (long)this->pointmarkindex * 4);
      if ((uVar21 & 1) == 0) {
        *(uint *)(lVar24 + 4 + (long)this->pointmarkindex * 4) = uVar21 | 1;
        pcVar14 = arraypool::getblock(botpoints,(int)botpoints->objects);
        uVar6 = botpoints->objects;
        botpoints->objects = uVar6 + 1;
        *(long *)(pcVar14 +
                 (long)botpoints->objectbytes * ((long)botpoints->objectsperblock - 1U & uVar6)) =
             lVar24;
      }
      puVar2 = (ulong *)(pcVar16 + lVar23);
      lVar24 = *(long *)(*puVar2 + (long)destpivot[(int)puVar2[1]] * 8);
      uVar21 = *(uint *)(lVar24 + 4 + (long)this->pointmarkindex * 4);
      if ((uVar21 & 1) == 0) {
        *(uint *)(lVar24 + 4 + (long)this->pointmarkindex * 4) = uVar21 | 1;
        pcVar14 = arraypool::getblock(toppoints,(int)toppoints->objects);
        uVar6 = toppoints->objects;
        toppoints->objects = uVar6 + 1;
        *(long *)(pcVar14 +
                 (long)toppoints->objectbytes * ((long)toppoints->objectsperblock - 1U & uVar6)) =
             lVar24;
      }
      piVar15 = (int *)(pcVar16 + lVar23 + 8);
      pppdVar22 = (tetrahedron *)*puVar2;
      piVar18 = piVar15;
      do {
        iVar4 = *piVar18;
        uVar21 = *(uint *)((long)pppdVar22 + (long)this->elemmarkerindex * 4);
        if ((uVar21 & 1) == 0) {
          *(uint *)((long)pppdVar22 + (long)this->elemmarkerindex * 4) = uVar21 | 1;
          pcVar16 = arraypool::getblock(crosstets,(int)crosstets->objects);
          lVar24 = (long)crosstets->objectbytes *
                   ((long)crosstets->objectsperblock - 1U & crosstets->objects);
          crosstets->objects = crosstets->objects + 1;
          *(tetrahedron **)(pcVar16 + lVar24) = pppdVar22;
          *(int *)(pcVar16 + lVar24 + 8) = iVar4;
        }
        pppdVar25 = pppdVar22 + facepivot1[iVar4];
        pppdVar22 = (tetrahedron *)((ulong)*pppdVar25 & 0xfffffffffffffff0);
        piVar18 = facepivot2[iVar4] + ((uint)*pppdVar25 & 0xf);
        pppdVar25 = (tetrahedron *)*puVar2;
      } while (pppdVar25 != pppdVar22);
      do {
        iVar4 = *piVar15;
        Q = pppdVar25[apexpivot[iVar4]];
        if ((Q != (tetrahedron)this->dummypoint) &&
           ((*(byte *)((long)Q + (long)this->pointmarkindex * 4 + 4) & 2) == 0)) {
          bVar12 = true;
          bVar10 = false;
          do {
            piVar18 = eprevtbl;
            if (!bVar10) {
              piVar18 = enexttbl;
            }
            uVar21 = piVar18[iVar4];
            pppdVar22 = pppdVar25;
            do {
              if ((*(uint *)((long)pppdVar22 + (long)this->elemmarkerindex * 4) >>
                   (*(byte *)(ver2edge + (int)uVar21) & 0x1f) & 0x40) != 0) {
                bVar12 = false;
                break;
              }
              pppdVar19 = pppdVar22 + facepivot1[(int)uVar21];
              pppdVar22 = (tetrahedron *)((ulong)*pppdVar19 & 0xfffffffffffffff0);
              uVar21 = facepivot2[(int)uVar21][(uint)*pppdVar19 & 0xf];
            } while (pppdVar25 != pppdVar22);
          } while ((!bVar10) && (bVar10 = true, bVar12));
          local_b0.tet = pppdVar22;
          local_b0.ver = uVar21;
          if (bVar12) {
            if (missingshs->objects < 1) {
              lVar24 = 0;
            }
            else {
              Q_00 = pppdVar25[orgpivot[iVar4]];
              P = pppdVar25[destpivot[iVar4]];
              lVar24 = 0;
              do {
                pcVar16 = missingshs->toparray
                          [(uint)lVar24 >> ((byte)missingshs->log2objectsperblock & 0x1f)];
                lVar20 = (long)missingshs->objectbytes *
                         (long)(int)(missingshs->objectsperblockmark & (uint)lVar24);
                local_d0 = (face *)(pcVar16 + lVar20);
                lVar23 = *(long *)(pcVar16 + lVar20);
                iVar5 = *(int *)(pcVar16 + lVar20 + 8);
                uVar13 = tri_edge_test(this,*(point *)(lVar23 + (long)sorgpivot[iVar5] * 8),
                                       *(point *)(lVar23 + (long)sdestpivot[iVar5] * 8),
                                       *(point *)(lVar23 + (long)sapexpivot[iVar5] * 8),(point)P,
                                       (point)Q,(point)0x0,1,types,poss);
                local_c8 = (char *)(ulong)uVar13;
                if (uVar13 != 0) {
                  if (uVar13 == 2) {
                    uVar21 = enexttbl[iVar4];
                    if ((types[0] & 0xfffffffeU) != 8) {
                      bVar11 = true;
                    }
                    local_c8 = (char *)0x2;
                    pppdVar22 = pppdVar25;
                    local_b0.tet = pppdVar25;
                    local_b0.ver = uVar21;
                  }
                  else {
                    bVar11 = true;
                  }
                  goto LAB_0012ebc0;
                }
                pppdVar7 = local_d0->sh;
                iVar5 = local_d0->shver;
                uVar13 = tri_edge_test(this,(point)pppdVar7[sorgpivot[iVar5]],
                                       (point)pppdVar7[sdestpivot[iVar5]],
                                       (point)pppdVar7[sapexpivot[iVar5]],(point)Q,(point)Q_00,
                                       (point)0x0,1,types,poss);
                local_c8 = (char *)(ulong)uVar13;
                if (uVar13 != 0) {
                  if (uVar13 == 2) {
                    uVar21 = eprevtbl[iVar4];
                    if ((types[0] & 0xfffffffeU) != 8) {
                      bVar11 = true;
                    }
                    local_c8 = (char *)0x2;
                    pppdVar22 = pppdVar25;
                    local_b0.tet = pppdVar25;
                    local_b0.ver = uVar21;
                  }
                  else {
                    bVar11 = true;
                  }
                  goto LAB_0012ebc0;
                }
                lVar24 = lVar24 + 1;
              } while (lVar24 < missingshs->objects);
              local_c8 = (char *)0x0;
            }
LAB_0012ebc0:
            if (missingshs->objects <= lVar24) {
              bVar11 = true;
              break;
            }
            if (bVar11) break;
            uVar21 = esymtbl[(int)uVar21];
            pppdVar19 = pppdVar22;
            uVar13 = uVar21;
            local_b0.ver = uVar21;
            if ((pppdVar22[8] != (tetrahedron)0x0) &&
               (pppdVar22[8][ver2edge[(int)uVar21]] != (double *)0x0)) {
              pppdVar7 = local_d0->sh;
              iVar4 = local_d0->shver;
              p1 = pppdVar7[sorgpivot[iVar4]];
              p2 = pppdVar7[sdestpivot[iVar4]];
              p3 = pppdVar7[sapexpivot[iVar4]];
              iedge = &local_b0;
LAB_0012f321:
              report_selfint_face(this,(point)p1,(point)p2,(point)p3,local_d0,iedge,(int)local_c8,
                                  types,poss);
            }
            do {
              if ((pppdVar19[9] != (tetrahedron)0x0) && (pppdVar19[9][uVar13 & 3] != (double *)0x0))
              break;
              pppdVar3 = pppdVar19 + (uVar13 & 3);
              pppdVar19 = (tetrahedron *)((ulong)*pppdVar3 & 0xfffffffffffffff0);
              uVar13 = fsymtbl[(int)uVar13][(uint)*pppdVar3 & 0xf];
            } while (pppdVar22 != pppdVar19);
            local_68.tet = pppdVar19;
            local_68.ver = uVar13;
            if ((pppdVar19[9] != (tetrahedron)0x0) && (pppdVar19[9][uVar13 & 3] != (double *)0x0)) {
              pppdVar7 = local_d0->sh;
              iVar4 = local_d0->shver;
              p1 = pppdVar7[sorgpivot[iVar4]];
              p2 = pppdVar7[sdestpivot[iVar4]];
              p3 = pppdVar7[sapexpivot[iVar4]];
              iedge = &local_68;
              goto LAB_0012f321;
            }
            puVar1 = (uint *)((long)pppdVar22 + (long)this->elemmarkerindex * 4);
            *puVar1 = *puVar1 | 0x40 << (*(byte *)(ver2edge + (int)uVar21) & 0x1f);
            pcVar16 = arraypool::getblock(topfaces,(int)topfaces->objects);
            lVar24 = (long)topfaces->objectbytes *
                     ((long)topfaces->objectsperblock - 1U & topfaces->objects);
            topfaces->objects = topfaces->objects + 1;
            *(tetrahedron **)(pcVar16 + lVar24) = pppdVar22;
            *(uint *)(pcVar16 + lVar24 + 8) = uVar21;
          }
        }
        pppdVar22 = pppdVar25 + facepivot1[iVar4];
        pppdVar25 = (tetrahedron *)((ulong)*pppdVar22 & 0xfffffffffffffff0);
        piVar15 = facepivot2[iVar4] + ((uint)*pppdVar22 & 0xf);
      } while ((tetrahedron *)*puVar2 != pppdVar25);
      local_78 = local_78 + 1;
      lVar24 = topfaces->objects;
    } while ((local_78 < lVar24) && (!bVar11));
  }
  if (0 < lVar24) {
    ppcVar8 = topfaces->toparray;
    lVar23 = 0;
    do {
      lVar20 = (long)topfaces->objectbytes *
               (long)(int)(topfaces->objectsperblockmark & (uint)lVar23);
      puVar1 = (uint *)(*(long *)(ppcVar8[(uint)lVar23 >>
                                          ((byte)topfaces->log2objectsperblock & 0x1f)] + lVar20) +
                       (long)this->elemmarkerindex * 4);
      *puVar1 = *puVar1 & ~(0x40 << (*(byte *)(ver2edge +
                                              *(int *)(ppcVar8[(uint)lVar23 >>
                                                               ((byte)topfaces->log2objectsperblock
                                                               & 0x1f)] + lVar20 + 8)) & 0x1f));
      lVar23 = lVar23 + 1;
    } while (lVar24 != lVar23);
  }
  topfaces->objects = 0;
  if (bVar11) {
    lVar24 = crosstets->objects;
    if (0 < lVar24) {
      ppcVar8 = crosstets->toparray;
      lVar23 = 0;
      do {
        puVar1 = (uint *)(*(long *)(ppcVar8[(uint)lVar23 >>
                                            ((byte)crosstets->log2objectsperblock & 0x1f)] +
                                   (long)crosstets->objectbytes *
                                   (long)(int)(crosstets->objectsperblockmark & (uint)lVar23)) +
                         (long)this->elemmarkerindex * 4);
        *puVar1 = *puVar1 & 0xfffffffe;
        lVar23 = lVar23 + 1;
      } while (lVar24 != lVar23);
    }
    lVar24 = botpoints->objects;
    if (0 < lVar24) {
      ppcVar8 = botpoints->toparray;
      lVar23 = 0;
      do {
        puVar1 = (uint *)(*(long *)(ppcVar8[(uint)lVar23 >>
                                            ((byte)botpoints->log2objectsperblock & 0x1f)] +
                                   (long)botpoints->objectbytes *
                                   (long)(int)(botpoints->objectsperblockmark & (uint)lVar23)) + 4 +
                         (long)this->pointmarkindex * 4);
        *puVar1 = *puVar1 & 0xfffffffe;
        lVar23 = lVar23 + 1;
      } while (lVar24 != lVar23);
    }
    lVar24 = toppoints->objects;
    if (0 < lVar24) {
      ppcVar8 = toppoints->toparray;
      lVar23 = 0;
      do {
        puVar1 = (uint *)(*(long *)(ppcVar8[(uint)lVar23 >>
                                            ((byte)toppoints->log2objectsperblock & 0x1f)] +
                                   (long)toppoints->objectbytes *
                                   (long)(int)(toppoints->objectsperblockmark & (uint)lVar23)) + 4 +
                         (long)this->pointmarkindex * 4);
        *puVar1 = *puVar1 & 0xfffffffe;
        lVar23 = lVar23 + 1;
      } while (lVar24 != lVar23);
    }
    crosstets->objects = 0;
    botpoints->objects = 0;
    toppoints->objects = 0;
    uVar17 = randomnation(this,(int)missingshs->objects - 1);
    pcVar16 = missingshs->toparray
              [(int)(uint)uVar17 >> ((byte)missingshs->log2objectsperblock & 0x1f)];
    lVar24 = (long)missingshs->objectbytes *
             (long)(int)((uint)uVar17 & missingshs->objectsperblockmark);
    (this->recentsh).sh = *(shellface **)(pcVar16 + lVar24);
    (this->recentsh).shver = *(int *)(pcVar16 + lVar24 + 8);
  }
  else {
    if (2 < this->b->verbose) {
      printf("      Formed cavity: %ld (%ld) cross tets (edges).\n",crosstets->objects,0);
    }
    if (0 < crosstets->objects) {
      lVar24 = 0;
      do {
        pcVar16 = crosstets->toparray[(uint)lVar24 >> ((byte)crosstets->log2objectsperblock & 0x1f)]
        ;
        lVar23 = (long)crosstets->objectbytes *
                 (long)(int)(crosstets->objectsperblockmark & (uint)lVar24);
        uVar6 = *(ulong *)(*(long *)(pcVar16 + lVar23) +
                          (ulong)(eorgoppotbl[*(int *)(pcVar16 + lVar23 + 8)] & 3) * 8);
        uVar26 = uVar6 & 0xfffffffffffffff0;
        if ((*(byte *)(uVar26 + (long)this->elemmarkerindex * 4) & 1) == 0) {
          iVar4 = fsymtbl[eorgoppotbl[*(int *)(pcVar16 + lVar23 + 8)]][(uint)uVar6 & 0xf];
          pcVar14 = arraypool::getblock(topfaces,(int)topfaces->objects);
          lVar20 = (long)topfaces->objectbytes *
                   ((long)topfaces->objectsperblock - 1U & topfaces->objects);
          topfaces->objects = topfaces->objects + 1;
          *(ulong *)(pcVar14 + lVar20) = uVar26;
          *(int *)(pcVar14 + lVar20 + 8) = iVar4;
        }
        uVar6 = *(ulong *)(*(long *)(pcVar16 + lVar23) +
                          (ulong)(edestoppotbl[*(int *)(pcVar16 + lVar23 + 8)] & 3) * 8);
        uVar26 = uVar6 & 0xfffffffffffffff0;
        iVar4 = fsymtbl[edestoppotbl[*(int *)(pcVar16 + lVar23 + 8)]][(uint)uVar6 & 0xf];
        if ((*(byte *)(uVar26 + (long)this->elemmarkerindex * 4) & 1) == 0) {
          pcVar16 = arraypool::getblock(botfaces,(int)botfaces->objects);
          lVar23 = (long)botfaces->objectbytes *
                   ((long)botfaces->objectsperblock - 1U & botfaces->objects);
          botfaces->objects = botfaces->objects + 1;
          *(ulong *)(pcVar16 + lVar23) = uVar26;
          *(int *)(pcVar16 + lVar23 + 8) = iVar4;
        }
        pdVar9 = *(point *)(uVar26 + (long)orgpivot[iVar4] * 8);
        uVar21 = *(uint *)((long)pdVar9 + (long)this->pointmarkindex * 4 + 4);
        if (((uVar21 & 1) == 0) && (pdVar9 != this->dummypoint)) {
          *(uint *)((long)pdVar9 + (long)this->pointmarkindex * 4 + 4) = uVar21 | 1;
          pcVar16 = arraypool::getblock(botpoints,(int)botpoints->objects);
          uVar6 = botpoints->objects;
          botpoints->objects = uVar6 + 1;
          *(point *)(pcVar16 +
                    (long)botpoints->objectbytes * ((long)botpoints->objectsperblock - 1U & uVar6))
               = pdVar9;
          pcVar16 = arraypool::getblock(toppoints,(int)toppoints->objects);
          uVar6 = toppoints->objects;
          toppoints->objects = uVar6 + 1;
          *(point *)(pcVar16 +
                    (long)toppoints->objectbytes * ((long)toppoints->objectsperblock - 1U & uVar6))
               = pdVar9;
        }
        pdVar9 = *(point *)(uVar26 + (long)destpivot[iVar4] * 8);
        uVar21 = *(uint *)((long)pdVar9 + (long)this->pointmarkindex * 4 + 4);
        if (((uVar21 & 1) == 0) && (pdVar9 != this->dummypoint)) {
          *(uint *)((long)pdVar9 + (long)this->pointmarkindex * 4 + 4) = uVar21 | 1;
          pcVar16 = arraypool::getblock(botpoints,(int)botpoints->objects);
          uVar6 = botpoints->objects;
          botpoints->objects = uVar6 + 1;
          *(point *)(pcVar16 +
                    (long)botpoints->objectbytes * ((long)botpoints->objectsperblock - 1U & uVar6))
               = pdVar9;
          pcVar16 = arraypool::getblock(toppoints,(int)toppoints->objects);
          uVar6 = toppoints->objects;
          toppoints->objects = uVar6 + 1;
          *(point *)(pcVar16 +
                    (long)toppoints->objectbytes * ((long)toppoints->objectsperblock - 1U & uVar6))
               = pdVar9;
        }
        lVar24 = lVar24 + 1;
      } while (lVar24 < crosstets->objects);
    }
    lVar24 = toppoints->objects;
    if (0 < lVar24) {
      ppcVar8 = toppoints->toparray;
      lVar23 = 0;
      do {
        puVar1 = (uint *)(*(long *)(ppcVar8[(uint)lVar23 >>
                                            ((byte)toppoints->log2objectsperblock & 0x1f)] +
                                   (long)toppoints->objectbytes *
                                   (long)(int)(toppoints->objectsperblockmark & (uint)lVar23)) + 4 +
                         (long)this->pointmarkindex * 4);
        *puVar1 = *puVar1 & 0xfffffffe;
        lVar23 = lVar23 + 1;
      } while (lVar24 != lVar23);
    }
    lVar24 = botpoints->objects;
    if (0 < lVar24) {
      ppcVar8 = botpoints->toparray;
      lVar23 = 0;
      do {
        puVar1 = (uint *)(*(long *)(ppcVar8[(uint)lVar23 >>
                                            ((byte)botpoints->log2objectsperblock & 0x1f)] +
                                   (long)botpoints->objectbytes *
                                   (long)(int)(botpoints->objectsperblockmark & (uint)lVar23)) + 4 +
                         (long)this->pointmarkindex * 4);
        *puVar1 = *puVar1 & 0xfffffffe;
        lVar23 = lVar23 + 1;
      } while (lVar24 != lVar23);
    }
    this->cavitycount = this->cavitycount + 1;
  }
  return (bool)~bVar11;
}

Assistant:

bool tetgenmesh::formcavity(triface* searchtet, arraypool* missingshs,
                            arraypool* crosstets, arraypool* topfaces, 
                            arraypool* botfaces, arraypool* toppoints, 
                            arraypool* botpoints)
{
  arraypool *crossedges;
  triface spintet, neightet, chkface, *parytet;
  face *parysh = NULL;
  point pa, pd, pe, *parypt;
  bool testflag, invalidflag;
  int intflag, types[2], poss[4];
  int t1ver;
  int i, j, k;

  // Temporarily re-use 'topfaces' for all crossing edges.
  crossedges = topfaces;

  if (b->verbose > 2) {
    printf("      Form the cavity of a missing region.\n"); 
  }
  // Mark this edge to avoid testing it later.
  markedge(*searchtet);
  crossedges->newindex((void **) &parytet);
  *parytet = *searchtet;

  invalidflag = 0; 
  // Collect all crossing tets.  Each cross tet is saved in the standard
  //   form [d,e,#,#], where [d,e] is a crossing edge, d lies below R.
  //   NEITHER d NOR e is a vertex of R (!pmarktested). 
  for (i = 0; i < crossedges->objects && !invalidflag; i++) {
    // Get a crossing edge [d,e,#,#].
    searchtet = (triface *) fastlookup(crossedges, i);
    // Sort vertices into the bottom and top arrays.
    pd = org(*searchtet);
    if (!pinfected(pd)) {
      pinfect(pd);
      botpoints->newindex((void **) &parypt);
      *parypt = pd;
    }
    pe = dest(*searchtet);
    if (!pinfected(pe)) {
      pinfect(pe);
      toppoints->newindex((void **) &parypt);
      *parypt = pe;
    }

    // All tets sharing this edge are crossing tets.
    spintet = *searchtet;
    while (1) {
      if (!infected(spintet)) {
        infect(spintet);
        crosstets->newindex((void **) &parytet);
        *parytet = spintet;
      }
      // Go to the next crossing tet.
      fnextself(spintet);
      if (spintet.tet == searchtet->tet) break;
    } // while (1)

    // Detect new crossing edges.
    spintet = *searchtet;
    while (1) {
      // spintet is [d,e,a,#], where d lies below R, and e lies above R. 
      pa = apex(spintet);
      if (pa != dummypoint) {
        if (!pmarktested(pa)) {
	      // There exists a crossing edge, either [e,a] or [a,d]. First check
          //   if the crossing edge has already be added, i.e.,to check if one
		  //   of the tetrahedron at this edge has been marked.
          testflag = true;
          for (j = 0; j < 2 && testflag; j++) {
            if (j == 0) {
              enext(spintet, neightet);
            } else {
              eprev(spintet, neightet);
            }
            while (1) {
              if (edgemarked(neightet)) {
                // This crossing edge has already been tested. Skip it.
                testflag = false;
                break;
              }
              fnextself(neightet);
              if (neightet.tet == spintet.tet) break;
            }
          } // j
          if (testflag) {
            // Test if [e,a] or [a,d] intersects R.
            // Do a brute-force search in the set of subfaces of R. Slow!
            //   Need to be improved!
            pd = org(spintet);
            pe = dest(spintet);
            for (k = 0; k < missingshs->objects; k++) {
              parysh = (face *) fastlookup(missingshs, k);
              intflag = tri_edge_test(sorg(*parysh), sdest(*parysh), 
                          sapex(*parysh), pe, pa, NULL, 1, types, poss);
              if (intflag > 0) {
                // Found intersection. 'a' lies below R.
				if (intflag == 2) {
                  enext(spintet, neightet);
				  if ((types[0] == (int) ACROSSFACE) || 
                      (types[0] == (int) ACROSSEDGE)) {
                    // Only this case is valid.
                  } else {
                    // A non-valid intersection. Maybe a PLC problem.
                    invalidflag = 1;
                  }
				} else {
				  // Coplanar intersection. Maybe a PLC problem.
				  invalidflag = 1;
				}
                break;
              }
              intflag = tri_edge_test(sorg(*parysh), sdest(*parysh), 
			              sapex(*parysh), pa, pd, NULL, 1, types, poss);
              if (intflag > 0) {
                // Found intersection. 'a' lies above R.
				if (intflag == 2) {
                  eprev(spintet, neightet);
				  if ((types[0] == (int) ACROSSFACE) || 
                      (types[0] == (int) ACROSSEDGE)) {
					// Only this case is valid.
                  } else {
				    // A non-valid intersection. Maybe a PLC problem.
                    invalidflag = 1;
                  }
				} else {
				  // Coplanar intersection. Maybe a PLC problem.
				  invalidflag = 1;
				}
                break;
              }
            } // k
            if (k < missingshs->objects) {
              // Found a pair of triangle - edge intersection.
              if (invalidflag) {
                break; // the while (1) loop
              }
              // Adjust the edge direction, so that its origin lies below R,
              //   and its destination lies above R.
              esymself(neightet);
              // This edge may be a segment.
              if (issubseg(neightet)) {
				report_selfint_face(sorg(*parysh), sdest(*parysh), 
                  sapex(*parysh),parysh,&neightet,intflag,types,poss);
              }
			  // Check if it is an edge of a subface.
			  chkface = neightet;
              while (1) {
                if (issubface(chkface)) break;
                fsymself(chkface);
                if (chkface.tet == neightet.tet) break;
              }
              if (issubface(chkface)) {
                // Two subfaces are intersecting.
                report_selfint_face(sorg(*parysh), sdest(*parysh), 
                  sapex(*parysh),parysh,&chkface,intflag,types,poss);
              }
			  
              // Mark this edge to avoid testing it again.
              markedge(neightet);
              crossedges->newindex((void **) &parytet);
              *parytet = neightet;            
            } else {
              // No intersection is found. It may be a PLC problem.
              invalidflag = 1;
              break; // the while (1) loop
            } // if (k == missingshs->objects)
          } // if (testflag)
	    } 
      } // if (pa != dummypoint)
      // Go to the next crossing tet.
      fnextself(spintet);
      if (spintet.tet == searchtet->tet) break;
    } // while (1)
  } // i

  // Unmark all marked edges.
  for (i = 0; i < crossedges->objects; i++) {
    searchtet = (triface *) fastlookup(crossedges, i);
    unmarkedge(*searchtet);
  }
  crossedges->restart();


  if (invalidflag) {
    // Unmark all collected tets.
    for (i = 0; i < crosstets->objects; i++) {
      searchtet = (triface *) fastlookup(crosstets, i);
      uninfect(*searchtet);
    }
    // Unmark all collected vertices.
    for (i = 0; i < botpoints->objects; i++) {
      parypt = (point *) fastlookup(botpoints, i);
      puninfect(*parypt);
    }
    for (i = 0; i < toppoints->objects; i++) {
      parypt = (point *) fastlookup(toppoints, i);
      puninfect(*parypt);
    }
    crosstets->restart();
    botpoints->restart();
    toppoints->restart();

    // Randomly split an interior edge of R.
    i = randomnation(missingshs->objects - 1);
    recentsh = * (face *) fastlookup(missingshs, i);
    return false;
  }

  if (b->verbose > 2) {
    printf("      Formed cavity: %ld (%ld) cross tets (edges).\n", 
           crosstets->objects, crossedges->objects);
  }

  // Collect the top and bottom faces and the middle vertices. Since all top
  //   and bottom vertices have been infected. Uninfected vertices must be
  //   middle vertices (i.e., the vertices of R).
  // NOTE 1: Hull tets may be collected. Process them as a normal one.
  // NOTE 2: Some previously recovered subfaces may be completely inside the
  //   cavity. In such case, we remove these subfaces from the cavity and put
  //   them into 'subfacstack'. They will be recovered later.
  // NOTE 3: Some segments may be completely inside the cavity, e.g., they
  //   attached to a subface which is inside the cavity. Such segments are
  //   put in 'subsegstack'. They will be recovered later. 
  // NOTE4 : The interior subfaces and segments mentioned in NOTE 2 and 3
  //   are identified in the routine "carvecavity()". 

  for (i = 0; i < crosstets->objects; i++) {
    searchtet = (triface *) fastlookup(crosstets, i);
    // searchtet is [d,e,a,b].
    eorgoppo(*searchtet, spintet);
    fsym(spintet, neightet); // neightet is [a,b,e,#]
    if (!infected(neightet)) {
      // A top face.
      topfaces->newindex((void **) &parytet);
      *parytet = neightet;
    }
    edestoppo(*searchtet, spintet);
    fsym(spintet, neightet); // neightet is [b,a,d,#]
    if (!infected(neightet)) {
      // A bottom face.
      botfaces->newindex((void **) &parytet);
      *parytet = neightet;
    }
    // Add middle vertices if there are (skip dummypoint).
    pa = org(neightet);
    if (!pinfected(pa)) {
      if (pa != dummypoint) {
        pinfect(pa);
        botpoints->newindex((void **) &parypt);
        *parypt = pa;
        toppoints->newindex((void **) &parypt);
        *parypt = pa;
      }
    }
    pa = dest(neightet);
    if (!pinfected(pa)) {
      if (pa != dummypoint) {
        pinfect(pa);
        botpoints->newindex((void **) &parypt);
        *parypt = pa;
        toppoints->newindex((void **) &parypt);
        *parypt = pa;
      }
    }
  } // i

  // Uninfect all collected top, bottom, and middle vertices.
  for (i = 0; i < toppoints->objects; i++) {
    parypt = (point *) fastlookup(toppoints, i);
    puninfect(*parypt);
  }
  for (i = 0; i < botpoints->objects; i++) {
    parypt = (point *) fastlookup(botpoints, i);
    puninfect(*parypt);
  }
  cavitycount++;

  return true;
}